

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger generator_getstatus(HSQUIRRELVM v)

{
  SQGeneratorState SVar1;
  SQString *pSVar2;
  SQObjectPtr *in_RDI;
  SQObject *o;
  SQObjectPtr *in_stack_ffffffffffffff78;
  SQVM *in_stack_ffffffffffffff80;
  SQVM *this;
  SQChar *in_stack_ffffffffffffff88;
  SQSharedState *in_stack_ffffffffffffff90;
  undefined1 local_50 [48];
  SQObjectPtr local_20;
  SQObjectPtr *local_10;
  SQObjectPtr *local_8;
  
  local_8 = in_RDI;
  local_10 = stack_get(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
  SVar1 = ((local_10->super_SQObject)._unVal.pGenerator)->_state;
  if (SVar1 == eRunning) {
    pSVar2 = SQString::Create(in_stack_ffffffffffffff90,(SQChar *)local_8,
                              (SQInteger)in_stack_ffffffffffffff80);
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)(local_50 + 0x10),pSVar2);
    SQVM::Push(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff80);
  }
  else if (SVar1 == eSuspended) {
    pSVar2 = SQString::Create(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                              (SQInteger)in_stack_ffffffffffffff80);
    SQObjectPtr::SQObjectPtr(&local_20,pSVar2);
    SQVM::Push(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff80);
  }
  else if (SVar1 == eDead) {
    pSVar2 = SQString::Create(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                              (SQInteger)in_stack_ffffffffffffff80);
    this = (SQVM *)local_50;
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)this,pSVar2);
    SQVM::Push(this,local_8);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this);
  }
  return 1;
}

Assistant:

static SQInteger generator_getstatus(HSQUIRRELVM v)
{
    SQObject &o=stack_get(v,1);
    switch(_generator(o)->_state){
        case SQGenerator::eSuspended:v->Push(SQString::Create(_ss(v),_SC("suspended")));break;
        case SQGenerator::eRunning:v->Push(SQString::Create(_ss(v),_SC("running")));break;
        case SQGenerator::eDead:v->Push(SQString::Create(_ss(v),_SC("dead")));break;
    }
    return 1;
}